

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O0

void __thiscall pg::PPQSolver::run(PPQSolver *this)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  uintqueue *puVar11;
  uint *puVar12;
  size_t sVar13;
  long lVar14;
  ostream *poVar15;
  Error *this_00;
  _label_vertex _Var16;
  int local_dc;
  undefined1 local_d8 [4];
  int i;
  undefined1 local_c8 [28];
  int v_2;
  int local_a8;
  _label_vertex local_a0;
  bitset local_90;
  _label_vertex local_70;
  bitset local_60;
  _label_vertex local_40;
  int local_30;
  int local_2c;
  int v_1;
  int local_24;
  int v;
  PPQSolver *this_local;
  uintqueue *local_10;
  
  this->iterations = 0;
  _v = this;
  uVar7 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar7);
  this->str = piVar8;
  piVar8 = this->str;
  piVar1 = this->str;
  lVar9 = Solver::nodecount(&this->super_Solver);
  local_24 = -1;
  std::fill<int*,int>(piVar8,piVar1 + lVar9,&local_24);
  uVar7 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar7);
  this->r = piVar8;
  for (v_1 = 0; lVar9 = (long)v_1, lVar10 = Solver::nodecount(&this->super_Solver), lVar9 < lVar10;
      v_1 = v_1 + 1) {
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)v_1);
    if (bVar5) {
      this->r[v_1] = -1;
    }
    else {
      iVar6 = Solver::priority(&this->super_Solver,v_1);
      this->r[v_1] = iVar6;
    }
  }
  uVar7 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar7 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar7);
  this->u = piVar8;
  piVar8 = this->u;
  piVar1 = this->u;
  lVar9 = Solver::nodecount(&this->super_Solver);
  local_2c = -1;
  std::fill<int*,int>(piVar8,piVar1 + lVar9,&local_2c);
  puVar11 = &this->Q;
  lVar9 = Solver::nodecount(&this->super_Solver);
  this_local._4_4_ = (uint)lVar9;
  (this->Q).pointer = 0;
  local_10 = puVar11;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  uVar7 = SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),0);
  if (SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar12 = (uint *)operator_new__(uVar7);
  puVar11->queue = puVar12;
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->L,sVar13);
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->R,sVar13);
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->U,sVar13);
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W0,sVar13);
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W1,sVar13);
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->G,sVar13);
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  bitset::flip(&this->G);
  bVar5 = bitset::any(&this->G);
  if (bVar5) {
    lVar9 = Solver::nodecount(&this->super_Solver);
    piVar8 = this->r;
    sVar13 = bitset::find_last(&this->G);
    iVar6 = piVar8[sVar13];
    lVar10 = Solver::nodecount(&this->super_Solver);
    lVar14 = Solver::nodecount(&this->super_Solver);
    solve(this,(int)lVar9 + -1,iVar6,0x7fffffff,(int)lVar10,(int)lVar14);
  }
  if (1 < (this->super_Solver).trace) {
    for (local_30 = 0; lVar9 = (long)local_30, lVar10 = Solver::nodecount(&this->super_Solver),
        lVar9 < lVar10; local_30 = local_30 + 1) {
      bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_30);
      if (!bVar5) {
        poVar15 = std::operator<<((this->super_Solver).logger,"vertex ");
        _Var16 = Solver::label_vertex(&this->super_Solver,local_30);
        local_60._bitssize = (size_t)_Var16.g;
        local_60._allocsize._0_4_ = _Var16.v;
        local_40.g = (Game *)local_60._bitssize;
        local_40.v = (int)local_60._allocsize;
        poVar15 = operator<<(poVar15,&local_40);
        std::operator<<(poVar15," is solved by");
        bitset::operator[](&local_60,(size_t)&this->W0);
        bVar5 = bitset::reference::operator_cast_to_bool((reference *)&local_60);
        if (bVar5) {
          std::operator<<((this->super_Solver).logger," even");
          iVar6 = Solver::owner(&this->super_Solver,local_30);
          if (iVar6 == 0) {
            std::operator<<((this->super_Solver).logger," (");
            if (this->str[local_30] == -1) {
              std::operator<<((this->super_Solver).logger,"-1");
            }
            else {
              poVar15 = (this->super_Solver).logger;
              _Var16 = Solver::label_vertex(&this->super_Solver,this->str[local_30]);
              local_90._bitssize = (size_t)_Var16.g;
              local_90._allocsize._0_4_ = _Var16.v;
              local_70.g = (Game *)local_90._bitssize;
              local_70.v = (int)local_90._allocsize;
              operator<<(poVar15,&local_70);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        bitset::operator[](&local_90,(size_t)&this->W1);
        bVar5 = bitset::reference::operator_cast_to_bool((reference *)&local_90);
        if (bVar5) {
          std::operator<<((this->super_Solver).logger," odd");
          iVar6 = Solver::owner(&this->super_Solver,local_30);
          if (iVar6 == 1) {
            std::operator<<((this->super_Solver).logger," (");
            if (this->str[local_30] == -1) {
              std::operator<<((this->super_Solver).logger,"-1");
            }
            else {
              poVar15 = (this->super_Solver).logger;
              _Var16 = Solver::label_vertex(&this->super_Solver,this->str[local_30]);
              register0x00000000 = _Var16.g;
              local_a8 = _Var16.v;
              local_a0.g = register0x00000000;
              local_a0.v = local_a8;
              operator<<(poVar15,&local_a0);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
    }
  }
  for (local_c8._20_4_ = 0; lVar9 = (long)(int)local_c8._20_4_,
      lVar10 = Solver::nodecount(&this->super_Solver), lVar9 < lVar10;
      local_c8._20_4_ = local_c8._20_4_ + 1) {
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_c8._20_4_);
    if (!bVar5) {
      bitset::operator[]((bitset *)local_c8,(size_t)&this->W0);
      bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_c8);
      if (bVar5) {
        Solver::solve(&this->super_Solver,local_c8._20_4_,0,this->str[(int)local_c8._20_4_]);
      }
      bitset::operator[]((bitset *)local_d8,(size_t)&this->W1);
      bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_d8);
      if (bVar5) {
        Solver::solve(&this->super_Solver,local_c8._20_4_,1,this->str[(int)local_c8._20_4_]);
      }
    }
  }
  poVar15 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
  poVar15 = std::operator<<(poVar15," iterations.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  local_dc = 0;
  while( true ) {
    lVar9 = Solver::nodecount(&this->super_Solver);
    if (lVar9 <= local_dc) {
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      return;
    }
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_dc);
    if (!bVar5) break;
    local_dc = local_dc + 1;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x40);
  Error::Error(this_00,"search was incomplete!",
               "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ppq.cpp"
               ,0x252);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void
PPQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];
    std::fill(str, str+nodecount(), -1);

    r = new int[nodecount()];
    for (int v=0; v<nodecount(); v++) {
        if (!disabled[v]) r[v] = priority(v);
        else r[v] = -1;
    }

    u = new int[nodecount()];
    std::fill(u, u+nodecount(), -1);

    Q.resize(nodecount());
    L.resize(nodecount());
    R.resize(nodecount());
    U.resize(nodecount());

    W0.resize(nodecount());
    W1.resize(nodecount());
    
    G.resize(nodecount()); 
    G = disabled;
    G.flip();

    if (G.any()) {
        solve(nodecount()-1, r[G.find_last()], INT_MAX, nodecount(), nodecount()); // caller has INT_MAX priority...
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    delete[] str;
}